

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess.h
# Opt level: O0

void __thiscall subprocess::Popen::execute_process(Popen *this)

{
  __pid_t _Var1;
  int iVar2;
  size_type sVar3;
  iterator __position;
  allocator<char> *__a;
  size_t sVar4;
  CalledProcessError *this_00;
  FILE *fp;
  Popen *in_RDI;
  long in_FS_OFFSET;
  exception *exp;
  int retcode;
  int read_bytes;
  int err_wr_pipe;
  int err_rd_pipe;
  Child chld;
  char err_buf [1024];
  undefined4 in_stack_fffffffffffffad8;
  int in_stack_fffffffffffffadc;
  Popen *in_stack_fffffffffffffae0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffae8;
  pair<int,_int> *in_stack_fffffffffffffaf0;
  undefined4 in_stack_fffffffffffffaf8;
  int in_stack_fffffffffffffafc;
  string *in_stack_fffffffffffffb00;
  OSError *in_stack_fffffffffffffb08;
  allocator<char> *in_stack_fffffffffffffb18;
  value_type *in_stack_fffffffffffffb20;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb28;
  undefined4 in_stack_fffffffffffffb50;
  undefined4 in_stack_fffffffffffffb54;
  char local_489;
  int local_460;
  int local_45c;
  FILE local_428 [1056];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  util::pipe_cloexec();
  std::tie<int,int>((int *)in_stack_fffffffffffffae0,
                    (int *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8));
  std::tuple<int&,int&>::operator=
            ((tuple<int_&,_int_&> *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
             in_stack_fffffffffffffaf0);
  sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::length
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8));
  if (sVar3 != 0) {
    in_stack_fffffffffffffb28 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&in_RDI->vargs_;
    __position = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)in_stack_fffffffffffffae0);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)in_stack_fffffffffffffae8,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)in_stack_fffffffffffffae0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::insert((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffffb28,(const_iterator)__position._M_current,
             in_stack_fffffffffffffb20);
    populate_c_argv((Popen *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffae8,(size_type)in_stack_fffffffffffffae0);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (in_stack_fffffffffffffae8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffae0);
  _Var1 = fork();
  in_RDI->child_pid_ = _Var1;
  if (in_RDI->child_pid_ < 0) {
    close(local_45c);
    close(local_460);
    __a = (allocator<char> *)__cxa_allocate_exception(0x10);
    __s = &local_489;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(in_stack_fffffffffffffb28,__s,__a);
    __errno_location();
    OSError::OSError(in_stack_fffffffffffffb08,in_stack_fffffffffffffb00,in_stack_fffffffffffffafc);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      __cxa_throw(__a,&OSError::typeinfo,OSError::~OSError);
    }
  }
  else {
    if (in_RDI->child_pid_ == 0) {
      detail::Streams::close_parent_fds
                ((Streams *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8));
      close(local_45c);
      detail::Child::Child
                ((Child *)in_stack_fffffffffffffae8,in_stack_fffffffffffffae0,
                 in_stack_fffffffffffffadc);
      detail::Child::execute_child
                ((Child *)CONCAT44(in_stack_fffffffffffffb54,in_stack_fffffffffffffb50));
    }
    else {
      close(local_460);
      detail::Streams::close_child_fds
                ((Streams *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8));
      fp = local_428;
      memset(fp,0,0x400);
      fdopen(local_45c,"r");
      iVar2 = util::read_atmost_n(fp,(char *)CONCAT44(in_stack_fffffffffffffafc,
                                                      in_stack_fffffffffffffaf8),
                                  (size_t)in_stack_fffffffffffffaf0);
      close(local_45c);
      if ((iVar2 != 0) || (sVar4 = strlen((char *)local_428), sVar4 != 0)) {
        wait(in_RDI,fp);
        this_00 = (CalledProcessError *)__cxa_allocate_exception(0x18);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffb28,(char *)in_stack_fffffffffffffb20,
                   in_stack_fffffffffffffb18);
        CalledProcessError::CalledProcessError
                  (this_00,(string *)in_stack_fffffffffffffae0,in_stack_fffffffffffffadc);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
          __cxa_throw(this_00,&CalledProcessError::typeinfo,CalledProcessError::~CalledProcessError)
          ;
        }
        goto LAB_0082ab37;
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      return;
    }
  }
LAB_0082ab37:
  __stack_chk_fail();
}

Assistant:

inline void Popen::execute_process() noexcept(false)
{
#ifdef __USING_WINDOWS__
  if (exe_name_.length()) {
    this->vargs_.insert(this->vargs_.begin(), this->exe_name_);
    this->populate_c_argv();
  }
  this->exe_name_ = vargs_[0];

  std::wstring_convert<std::codecvt_utf8_utf16<wchar_t>> converter;
  std::wstring argument;
  std::wstring command_line;

  for (auto arg : this->vargs_) {
    argument = converter.from_bytes(arg);
    util::quote_argument(argument, command_line, false);
    command_line += L" ";
  }

  // CreateProcessW can modify szCmdLine so we allocate needed memory
  wchar_t *szCmdline = new wchar_t[command_line.size() + 1];
  wcscpy_s(szCmdline, command_line.size() + 1, command_line.c_str());
  PROCESS_INFORMATION piProcInfo;
  STARTUPINFOW siStartInfo;
  BOOL bSuccess = FALSE;
  DWORD creation_flags = CREATE_UNICODE_ENVIRONMENT | CREATE_NO_WINDOW;

  // Set up members of the PROCESS_INFORMATION structure.
  ZeroMemory(&piProcInfo, sizeof(PROCESS_INFORMATION));

  // Set up members of the STARTUPINFOW structure.
  // This structure specifies the STDIN and STDOUT handles for redirection.

  ZeroMemory(&siStartInfo, sizeof(STARTUPINFOW));
  siStartInfo.cb = sizeof(STARTUPINFOW);

  siStartInfo.hStdError = this->stream_.g_hChildStd_ERR_Wr;
  siStartInfo.hStdOutput = this->stream_.g_hChildStd_OUT_Wr;
  siStartInfo.hStdInput = this->stream_.g_hChildStd_IN_Rd;

  siStartInfo.dwFlags |= STARTF_USESTDHANDLES;

  // Create the child process.
  bSuccess = CreateProcessW(NULL,
                            szCmdline,    // command line
                            NULL,         // process security attributes
                            NULL,         // primary thread security attributes
                            TRUE,         // handles are inherited
                            creation_flags,	// creation flags
                            NULL,         // use parent's environment
                            NULL,         // use parent's current directory
                            &siStartInfo, // STARTUPINFOW pointer
                            &piProcInfo); // receives PROCESS_INFORMATION

  // If an error occurs, exit the application.
  if (!bSuccess) {
    DWORD errorMessageID = ::GetLastError();
    throw CalledProcessError("CreateProcess failed: " + util::get_last_error(errorMessageID), errorMessageID);
  }

  CloseHandle(piProcInfo.hThread);

  /*
    TODO: use common apis to close linux handles
  */

  this->process_handle_ = piProcInfo.hProcess;

  this->cleanup_future_ = std::async(std::launch::async, [this] {
    WaitForSingleObject(this->process_handle_, INFINITE);

    CloseHandle(this->stream_.g_hChildStd_ERR_Wr);
    CloseHandle(this->stream_.g_hChildStd_OUT_Wr);
    CloseHandle(this->stream_.g_hChildStd_IN_Rd);
  });

/*
  NOTE: In the linux version, there is a check to make sure that the process
        has been started. Here, we do nothing because CreateProcess will throw
        if we fail to create the process.
*/


#else

  int err_rd_pipe, err_wr_pipe;
  std::tie(err_rd_pipe, err_wr_pipe) = util::pipe_cloexec();

  if (exe_name_.length()) {
    vargs_.insert(vargs_.begin(), exe_name_);
    populate_c_argv();
  }
  exe_name_ = vargs_[0];

  child_pid_ = fork();

  if (child_pid_ < 0) {
    close(err_rd_pipe);
    close(err_wr_pipe);
    throw OSError("fork failed", errno);
  }

  if (child_pid_ == 0)
  {
    // Close descriptors belonging to parent
    stream_.close_parent_fds();

    //Close the read end of the error pipe
    close(err_rd_pipe);

    detail::Child chld(this, err_wr_pipe);
    chld.execute_child();
  }
  else
  {
    close (err_wr_pipe);// close child side of pipe, else get stuck in read below

    stream_.close_child_fds();

    try {
      char err_buf[SP_MAX_ERR_BUF_SIZ] = {0,};

      int read_bytes = util::read_atmost_n(
                                  fdopen(err_rd_pipe, "r"),
                                  err_buf,
                                  SP_MAX_ERR_BUF_SIZ);
      close(err_rd_pipe);

      if (read_bytes || strlen(err_buf)) {
        // Call waitpid to reap the child process
        // waitpid suspends the calling process until the
        // child terminates.
        int retcode = wait();

        // Throw whatever information we have about child failure
        throw CalledProcessError(err_buf, retcode);
      }
    } catch (std::exception& exp) {
      stream_.cleanup_fds();
      throw;
    }

  }
#endif
}